

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O2

size_t ZSTD_decompressBegin(ZSTD_DCtx *dctx)

{
  size_t sVar1;
  undefined1 auVar2 [32];
  
  if (dctx != (ZSTD_DCtx *)0x0) {
    sVar1 = ZSTD_startingInputLength(dctx->format);
    dctx->expected = sVar1;
    dctx->decodedSize = 0;
    dctx->previousDstEnd = (void *)0x0;
    dctx->prefixStart = (void *)0x0;
    dctx->virtualStart = (void *)0x0;
    dctx->dictEnd = (void *)0x0;
    (dctx->entropy).hufTable[0] = 0xc00000c;
    dctx->litEntropy = 0;
    dctx->fseEntropy = 0;
    auVar2._8_8_ = dctx;
    auVar2._0_8_ = dctx;
    auVar2._16_8_ = dctx;
    auVar2._24_8_ = dctx;
    dctx->dictID = 0;
    auVar2 = vpaddq_avx2(auVar2,_DAT_00191580);
    dctx->bType = bt_reserved;
    dctx->stage = ZSTDds_getFrameHeaderSize;
    (dctx->entropy).rep[0] = 1;
    (dctx->entropy).rep[1] = 4;
    (dctx->entropy).rep[2] = 8;
    dctx->LLTptr = (ZSTD_seqSymbol *)auVar2._0_8_;
    dctx->MLTptr = (ZSTD_seqSymbol *)auVar2._8_8_;
    dctx->OFTptr = (ZSTD_seqSymbol *)auVar2._16_8_;
    dctx->HUFptr = (HUF_DTable *)auVar2._24_8_;
    return 0;
  }
  __assert_fail("dctx != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/sci-visus[P]idx2/Source/Core/zstd/zstd.c"
                ,0x5e23,"size_t ZSTD_decompressBegin(ZSTD_DCtx *)");
}

Assistant:

size_t ZSTD_decompressBegin(ZSTD_DCtx* dctx)
{
    assert(dctx != NULL);
    dctx->expected = ZSTD_startingInputLength(dctx->format);  /* dctx->format must be properly set */
    dctx->stage = ZSTDds_getFrameHeaderSize;
    dctx->decodedSize = 0;
    dctx->previousDstEnd = NULL;
    dctx->prefixStart = NULL;
    dctx->virtualStart = NULL;
    dctx->dictEnd = NULL;
    dctx->entropy.hufTable[0] = (HUF_DTable)((HufLog)*0x1000001);  /* cover both little and big endian */
    dctx->litEntropy = dctx->fseEntropy = 0;
    dctx->dictID = 0;
    dctx->bType = bt_reserved;
    ZSTD_STATIC_ASSERT(sizeof(dctx->entropy.rep) == sizeof(repStartValue));
    memcpy(dctx->entropy.rep, repStartValue, sizeof(repStartValue));  /* initial repcodes */
    dctx->LLTptr = dctx->entropy.LLTable;
    dctx->MLTptr = dctx->entropy.MLTable;
    dctx->OFTptr = dctx->entropy.OFTable;
    dctx->HUFptr = dctx->entropy.hufTable;
    return 0;
}